

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fat.cpp
# Opt level: O0

void __thiscall fat::print_directory(fat *this,int iteration_level,int32_t curr_dir)

{
  int32_t iVar1;
  size_type sVar2;
  reference pvVar3;
  ostream *poVar4;
  int local_54;
  int local_50;
  int j;
  int i;
  allocator local_39;
  string local_38 [8];
  string indent;
  int32_t curr_dir_local;
  int iteration_level_local;
  fat *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  for (local_50 = 0; local_50 < iteration_level; local_50 = local_50 + 1) {
    std::__cxx11::string::append((char *)local_38);
  }
  for (local_54 = 0;
      sVar2 = std::vector<fat::directory_info,_std::allocator<fat::directory_info>_>::size
                        (&this->dir_info), (ulong)(long)local_54 < sVar2; local_54 = local_54 + 1) {
    pvVar3 = std::vector<fat::directory_info,_std::allocator<fat::directory_info>_>::at
                       (&this->dir_info,(long)local_54);
    if (pvVar3->parent_dir == curr_dir) {
      pvVar3 = std::vector<fat::directory_info,_std::allocator<fat::directory_info>_>::at
                         (&this->dir_info,(long)local_54);
      if ((pvVar3->dir->is_file & 1U) == 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,local_38);
        poVar4 = std::operator<<(poVar4,"+");
        pvVar3 = std::vector<fat::directory_info,_std::allocator<fat::directory_info>_>::at
                           (&this->dir_info,(long)local_54);
        poVar4 = std::operator<<(poVar4,pvVar3->dir->name);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        pvVar3 = std::vector<fat::directory_info,_std::allocator<fat::directory_info>_>::at
                           (&this->dir_info,(long)local_54);
        print_directory(this,iteration_level + 1,pvVar3->dir->start_cluster);
        poVar4 = std::operator<<((ostream *)&std::cout,local_38);
        poVar4 = std::operator<<(poVar4,"--");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,local_38);
        poVar4 = std::operator<<(poVar4,"-");
        pvVar3 = std::vector<fat::directory_info,_std::allocator<fat::directory_info>_>::at
                           (&this->dir_info,(long)local_54);
        poVar4 = std::operator<<(poVar4,pvVar3->dir->name);
        poVar4 = std::operator<<(poVar4," ");
        pvVar3 = std::vector<fat::directory_info,_std::allocator<fat::directory_info>_>::at
                           (&this->dir_info,(long)local_54);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar3->dir->start_cluster);
        poVar4 = std::operator<<(poVar4," ");
        pvVar3 = std::vector<fat::directory_info,_std::allocator<fat::directory_info>_>::at
                           (&this->dir_info,(long)local_54);
        iVar1 = get_cluster_count(this,pvVar3->dir->start_cluster);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void fat::print_directory(int iteration_level, int32_t curr_dir) {
    std::string indent = "";
    for (int i = 0; i < iteration_level; i++) {
        indent.append("\t");
    }
    for (int j = 0; j < dir_info.size(); j++) {
        if (dir_info.at(j).parent_dir == curr_dir) {
            if (dir_info.at(j).dir->is_file) {

                std::cout << indent << "-" << dir_info.at(j).dir->name << " " << dir_info.at(j).dir->start_cluster
                          << " " << get_cluster_count(dir_info.at(j).dir->start_cluster)
                          << std::endl;
            } else {
                std::cout << indent << "+" << dir_info.at(j).dir->name << std::endl;
                print_directory(iteration_level + 1, dir_info.at(j).dir->start_cluster);
                std::cout << indent << "--" << std::endl;
            }
        }
    }
}